

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O3

IOTHUB_CLIENT_RESULT
IoTHubClientCore_LL_SendMessageDisposition
          (IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle,IOTHUB_MESSAGE_HANDLE message_handle,
          IOTHUBMESSAGE_DISPOSITION_RESULT disposition)

{
  IOTHUB_CLIENT_RESULT IVar1;
  LOGGER_LOG p_Var2;
  
  if (iotHubClientHandle == (IOTHUB_CLIENT_CORE_LL_HANDLE)0x0 ||
      message_handle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendMessageDisposition",0x819,1,
                "Invalid argument handle=%p, message_handle=%p",iotHubClientHandle,message_handle);
    }
  }
  else {
    if (disposition != IOTHUBMESSAGE_ASYNC_ACK) {
      IVar1 = (*iotHubClientHandle->IoTHubTransport_SendMessageDisposition)
                        (iotHubClientHandle->deviceHandle,message_handle,disposition);
      return IVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_SendMessageDisposition",0x81e,1,
                "IOTHUBMESSAGE_ASYNC_ACK is not a valid disposition value for this function");
    }
  }
  return IOTHUB_CLIENT_INVALID_ARG;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubClientCore_LL_SendMessageDisposition(IOTHUB_CLIENT_CORE_LL_HANDLE iotHubClientHandle, IOTHUB_MESSAGE_HANDLE message_handle, IOTHUBMESSAGE_DISPOSITION_RESULT disposition)
{
    IOTHUB_CLIENT_RESULT result;
    if ((iotHubClientHandle == NULL) || (message_handle == NULL))
    {
        LogError("Invalid argument handle=%p, message_handle=%p", iotHubClientHandle, message_handle);
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else if (disposition == IOTHUBMESSAGE_ASYNC_ACK)
    {
        LogError("IOTHUBMESSAGE_ASYNC_ACK is not a valid disposition value for this function");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)iotHubClientHandle;
        result = handleData->IoTHubTransport_SendMessageDisposition(handleData->deviceHandle, message_handle, disposition);
    }
    return result;
}